

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

size_t secp256k1_pippenger_scratch_size(size_t n_points,int bucket_window)

{
  return (ulong)((int)(0x7f / (ulong)(bucket_window + 1)) * 4 + 0xa0) * (n_points * 2 + 2) +
         (0x98L << ((byte)bucket_window & 0x3f)) + 0x10;
}

Assistant:

static size_t secp256k1_pippenger_scratch_size(size_t n_points, int bucket_window) {
    size_t entries = 2*n_points + 2;
    size_t entry_size = sizeof(secp256k1_ge) + sizeof(secp256k1_scalar) + sizeof(struct secp256k1_pippenger_point_state) + (WNAF_SIZE(bucket_window+1)+1)*sizeof(int);
    return (sizeof(secp256k1_gej) << bucket_window) + sizeof(struct secp256k1_pippenger_state) + entries * entry_size;
}